

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O0

int parser_bare_item(sf_parser *sfp,sf_value *dest)

{
  sf_value *dest_00;
  sf_parser *in_RSI;
  sf_parser *in_RDI;
  sf_value *unaff_retaddr;
  sf_parser *in_stack_00000008;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  dest_00 = (sf_value *)(ulong)(*in_RDI->pos - 0x22);
  switch(dest_00) {
  case (sf_value *)0x0:
    iVar1 = parser_string(in_stack_00000008,unaff_retaddr);
    break;
  default:
    iVar1 = -1;
    break;
  case (sf_value *)0x8:
  case (sf_value *)0x1f:
  case (sf_value *)0x20:
  case (sf_value *)0x21:
  case (sf_value *)0x22:
  case (sf_value *)0x23:
  case (sf_value *)0x24:
  case (sf_value *)0x25:
  case (sf_value *)0x26:
  case (sf_value *)0x27:
  case (sf_value *)0x28:
  case (sf_value *)0x29:
  case (sf_value *)0x2a:
  case (sf_value *)0x2b:
  case (sf_value *)0x2c:
  case (sf_value *)0x2d:
  case (sf_value *)0x2e:
  case (sf_value *)0x2f:
  case (sf_value *)0x30:
  case (sf_value *)0x31:
  case (sf_value *)0x32:
  case (sf_value *)0x33:
  case (sf_value *)0x34:
  case (sf_value *)0x35:
  case (sf_value *)0x36:
  case (sf_value *)0x37:
  case (sf_value *)0x38:
  case (sf_value *)0x3f:
  case (sf_value *)0x40:
  case (sf_value *)0x41:
  case (sf_value *)0x42:
  case (sf_value *)0x43:
  case (sf_value *)0x44:
  case (sf_value *)0x45:
  case (sf_value *)0x46:
  case (sf_value *)0x47:
  case (sf_value *)0x48:
  case (sf_value *)0x49:
  case (sf_value *)0x4a:
  case (sf_value *)0x4b:
  case (sf_value *)0x4c:
  case (sf_value *)0x4d:
  case (sf_value *)0x4e:
  case (sf_value *)0x4f:
  case (sf_value *)0x50:
  case (sf_value *)0x51:
  case (sf_value *)0x52:
  case (sf_value *)0x53:
  case (sf_value *)0x54:
  case (sf_value *)0x55:
  case (sf_value *)0x56:
  case (sf_value *)0x57:
  case (sf_value *)0x58:
    iVar1 = parser_token(in_RDI,(sf_value *)in_RSI);
    break;
  case (sf_value *)0xb:
  case (sf_value *)0xe:
  case (sf_value *)0xf:
  case (sf_value *)0x10:
  case (sf_value *)0x11:
  case (sf_value *)0x12:
  case (sf_value *)0x13:
  case (sf_value *)0x14:
  case (sf_value *)0x15:
  case (sf_value *)0x16:
  case (sf_value *)0x17:
    iVar1 = parser_number(in_stack_00000008,unaff_retaddr);
    break;
  case (sf_value *)0x18:
    iVar1 = parser_byteseq(in_stack_00000008,unaff_retaddr);
    break;
  case (sf_value *)0x1d:
    iVar1 = parser_boolean(in_RSI,dest_00);
    break;
  case (sf_value *)0x1e:
    iVar1 = parser_date((sf_parser *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (sf_value *)in_RDI);
  }
  return iVar1;
}

Assistant:

static int parser_bare_item(sf_parser *sfp, sf_value *dest) {
  switch (*sfp->pos) {
  case '"':
    return parser_string(sfp, dest);
  case '-':
  DIGIT_CASES:
    return parser_number(sfp, dest);
  case '@':
    return parser_date(sfp, dest);
  case ':':
    return parser_byteseq(sfp, dest);
  case '?':
    return parser_boolean(sfp, dest);
  case '*':
  ALPHA_CASES:
    return parser_token(sfp, dest);
  default:
    return SF_ERR_PARSE_ERROR;
  }
}